

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

bool cfd::core::SchnorrSignature::IsValidSigHashType(uint8_t sighash_type_value)

{
  byte bVar1;
  undefined1 local_9;
  bool is_anyone_can_pay;
  uint8_t sighash_type_value_local;
  
  bVar1 = (char)sighash_type_value >> 7 & 1;
  if (((bVar1 == 0) || ((0x80 < sighash_type_value && (sighash_type_value < 0x84)))) &&
     ((bVar1 != 0 || (sighash_type_value < 4)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool SchnorrSignature::IsValidSigHashType(uint8_t sighash_type_value) {
  bool is_anyone_can_pay = (sighash_type_value & 0x80) ? true : false;
  if ((is_anyone_can_pay &&
       ((sighash_type_value <= 0x80) || (sighash_type_value > 0x83))) ||
      ((!is_anyone_can_pay) && (sighash_type_value > 0x03))) {
    return false;
  }
  return true;
}